

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

btScalar __thiscall
btConvexHullComputer::compute
          (btConvexHullComputer *this,void *coords,bool doubleCoords,int stride,int count,
          btScalar shrink,btScalar shrinkClamp)

{
  btAlignedObjectArray<btConvexHullComputer::Edge> *this_00;
  long lVar1;
  Vertex *v;
  Edge *pEVar2;
  Edge *pEVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Edge **ppEVar6;
  int iVar7;
  long lVar8;
  Edge *pEVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  Edge *e;
  Edge *pEVar13;
  int iVar14;
  ulong uVar15;
  btScalar local_144;
  btVector3 local_130;
  btAlignedObjectArray<btConvexHullInternal::Vertex_*> oldVertices;
  btConvexHullInternal hull;
  
  if (count < 1) {
    btAlignedObjectArray<btVector3>::clear(&this->vertices);
    btAlignedObjectArray<btConvexHullComputer::Edge>::clear(&this->edges);
    btAlignedObjectArray<int>::clear(&this->faces);
    local_144 = 0.0;
  }
  else {
    hull.vertexPool.arrays = (PoolArray<btConvexHullInternal::Vertex> *)0x0;
    hull.vertexPool.nextArray = (PoolArray<btConvexHullInternal::Vertex> *)0x0;
    hull.vertexPool.freeObjects = (Vertex *)0x0;
    hull.vertexPool.arraySize = 0x100;
    hull.edgePool.freeObjects = (Edge *)0x0;
    hull.edgePool.arrays = (PoolArray<btConvexHullInternal::Edge> *)0x0;
    hull.edgePool.nextArray = (PoolArray<btConvexHullInternal::Edge> *)0x0;
    hull.edgePool.arraySize = 0x100;
    hull.facePool.arrays = (PoolArray<btConvexHullInternal::Face> *)0x0;
    hull.facePool.nextArray = (PoolArray<btConvexHullInternal::Face> *)0x0;
    hull.facePool.freeObjects = (Face *)0x0;
    hull.facePool.arraySize = 0x100;
    hull.originalVertices.m_ownsMemory = true;
    hull.originalVertices.m_data = (Vertex **)0x0;
    hull.originalVertices.m_size = 0;
    hull.originalVertices.m_capacity = 0;
    btConvexHullInternal::compute(&hull,coords,doubleCoords,stride,count);
    local_144 = 0.0;
    if ((shrink <= 0.0) ||
       (local_144 = btConvexHullInternal::shrink(&hull,shrink,shrinkClamp), 0.0 <= local_144)) {
      btAlignedObjectArray<btVector3>::resize(&this->vertices,0,(btVector3 *)&oldVertices);
      oldVertices.m_capacity = 0;
      this_00 = &this->edges;
      oldVertices._0_4_ = 0;
      oldVertices.m_size = 0;
      btAlignedObjectArray<btConvexHullComputer::Edge>::resize(this_00,0,(Edge *)&oldVertices);
      oldVertices._0_4_ = 0;
      btAlignedObjectArray<int>::resize(&this->faces,0,(int *)&oldVertices);
      oldVertices.m_ownsMemory = true;
      oldVertices.m_data = (Vertex **)0x0;
      oldVertices.m_size = 0;
      oldVertices.m_capacity = 0;
      getVertexCopy(hull.vertexList,&oldVertices);
      for (uVar11 = 0; (long)uVar11 < (long)oldVertices.m_size; uVar11 = uVar11 + 1) {
        v = oldVertices.m_data[uVar11];
        local_130 = btConvexHullInternal::getCoordinates(&hull,v);
        btAlignedObjectArray<btVector3>::push_back(&this->vertices,&local_130);
        pEVar2 = v->edges;
        if (pEVar2 != (Edge *)0x0) {
          pEVar13 = pEVar2;
          iVar12 = -1;
          iVar14 = -1;
          do {
            if (pEVar13->copy < 0) {
              iVar7 = (this->edges).m_size;
              local_130.m_floats[2] = 0.0;
              auVar4._8_8_ = 0;
              auVar4._0_4_ = local_130.m_floats[2];
              auVar4._4_4_ = local_130.m_floats[3];
              local_130.m_floats = (btScalar  [4])(auVar4 << 0x40);
              btAlignedObjectArray<btConvexHullComputer::Edge>::push_back
                        (this_00,(Edge *)&local_130);
              local_130.m_floats[2] = 0.0;
              auVar5._8_8_ = 0;
              auVar5._0_4_ = local_130.m_floats[2];
              auVar5._4_4_ = local_130.m_floats[3];
              local_130.m_floats = (btScalar  [4])(auVar5 << 0x40);
              btAlignedObjectArray<btConvexHullComputer::Edge>::push_back
                        (this_00,(Edge *)&local_130);
              lVar8 = (long)iVar7;
              pEVar3 = (this->edges).m_data;
              lVar1 = lVar8 + 1;
              pEVar13->copy = iVar7;
              pEVar13->reverse->copy = (int)lVar1;
              pEVar3[lVar8].reverse = 1;
              pEVar3[lVar1].reverse = -1;
              iVar7 = getVertexCopy(pEVar13->target,&oldVertices);
              pEVar3[lVar8].targetVertex = iVar7;
              pEVar3[lVar1].targetVertex = (int)uVar11;
            }
            iVar7 = pEVar13->copy;
            iVar10 = iVar7;
            if (-1 < iVar12) {
              (this->edges).m_data[iVar7].next = iVar12 - iVar7;
              iVar10 = iVar14;
            }
            pEVar13 = pEVar13->next;
            iVar12 = iVar7;
            iVar14 = iVar10;
          } while (pEVar13 != pEVar2);
          (this->edges).m_data[iVar10].next = iVar7 - iVar10;
        }
      }
      for (uVar15 = 0; uVar15 != (uVar11 & 0xffffffff); uVar15 = uVar15 + 1) {
        pEVar2 = oldVertices.m_data[uVar15]->edges;
        pEVar13 = pEVar2;
        if (pEVar2 != (Edge *)0x0) {
          do {
            if (-1 < pEVar13->copy) {
              btAlignedObjectArray<int>::push_back(&this->faces,&pEVar13->copy);
              pEVar9 = pEVar13;
              do {
                pEVar9->copy = -1;
                pEVar9 = pEVar9->reverse->prev;
              } while (pEVar9 != pEVar13);
            }
            ppEVar6 = &pEVar13->next;
            pEVar13 = *ppEVar6;
          } while (*ppEVar6 != pEVar2);
        }
      }
      btAlignedObjectArray<btConvexHullInternal::Vertex_*>::~btAlignedObjectArray(&oldVertices);
    }
    else {
      btAlignedObjectArray<btVector3>::clear(&this->vertices);
      btAlignedObjectArray<btConvexHullComputer::Edge>::clear(&this->edges);
      btAlignedObjectArray<int>::clear(&this->faces);
    }
    btConvexHullInternal::~btConvexHullInternal(&hull);
  }
  return local_144;
}

Assistant:

btScalar btConvexHullComputer::compute(const void* coords, bool doubleCoords, int stride, int count, btScalar shrink, btScalar shrinkClamp)
{
	if (count <= 0)
	{
		vertices.clear();
		edges.clear();
		faces.clear();
		return 0;
	}

	btConvexHullInternal hull;
	hull.compute(coords, doubleCoords, stride, count);

	btScalar shift = 0;
	if ((shrink > 0) && ((shift = hull.shrink(shrink, shrinkClamp)) < 0))
	{
		vertices.clear();
		edges.clear();
		faces.clear();
		return shift;
	}

	vertices.resize(0);
	edges.resize(0);
	faces.resize(0);

	btAlignedObjectArray<btConvexHullInternal::Vertex*> oldVertices;
	getVertexCopy(hull.vertexList, oldVertices);
	int copied = 0;
	while (copied < oldVertices.size())
	{
		btConvexHullInternal::Vertex* v = oldVertices[copied];
		vertices.push_back(hull.getCoordinates(v));
		btConvexHullInternal::Edge* firstEdge = v->edges;
		if (firstEdge)
		{
			int firstCopy = -1;
			int prevCopy = -1;
			btConvexHullInternal::Edge* e = firstEdge;
			do
			{
				if (e->copy < 0)
				{
					int s = edges.size();
					edges.push_back(Edge());
					edges.push_back(Edge());
					Edge* c = &edges[s];
					Edge* r = &edges[s + 1];
					e->copy = s;
					e->reverse->copy = s + 1;
					c->reverse = 1;
					r->reverse = -1;
					c->targetVertex = getVertexCopy(e->target, oldVertices);
					r->targetVertex = copied;
#ifdef DEBUG_CONVEX_HULL
					printf("      CREATE: Vertex *%d has edge to *%d\n", copied, c->getTargetVertex());
#endif
				}
				if (prevCopy >= 0)
				{
					edges[e->copy].next = prevCopy - e->copy;
				}
				else
				{
					firstCopy = e->copy;
				}
				prevCopy = e->copy;
				e = e->next;
			} while (e != firstEdge);
			edges[firstCopy].next = prevCopy - firstCopy;
		}
		copied++;
	}

	for (int i = 0; i < copied; i++)
	{
		btConvexHullInternal::Vertex* v = oldVertices[i];
		btConvexHullInternal::Edge* firstEdge = v->edges;
		if (firstEdge)
		{
			btConvexHullInternal::Edge* e = firstEdge;
			do
			{
				if (e->copy >= 0)
				{
#ifdef DEBUG_CONVEX_HULL
					printf("Vertex *%d has edge to *%d\n", i, edges[e->copy].getTargetVertex());
#endif
					faces.push_back(e->copy);
					btConvexHullInternal::Edge* f = e;
					do
					{
#ifdef DEBUG_CONVEX_HULL
						printf("   Face *%d\n", edges[f->copy].getTargetVertex());
#endif
						f->copy = -1;
						f = f->reverse->prev;
					} while (f != e);
				}
				e = e->next;
			} while (e != firstEdge);
		}
	}

	return shift;
}